

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O1

Cluster * __thiscall dynet::Cluster::add_child(Cluster *this,uint sym)

{
  pointer *pppCVar1;
  iterator __position;
  iterator __position_00;
  _Hash_node_base *p_Var2;
  Cluster *this_00;
  ulong uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  Cluster *c;
  uint local_2c;
  Cluster *local_28;
  ulong local_20;
  
  uVar3 = (this->word2ind)._M_h._M_bucket_count;
  uVar4 = (ulong)sym % uVar3;
  p_Var5 = (this->word2ind)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(uint *)&p_Var5->_M_nxt[1]._M_nxt != sym)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar3 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == sym)) goto LAB_00278d08;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00278d08:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    local_2c = sym;
    this_00 = (Cluster *)operator_new(0xc0);
    Cluster(this_00);
    this_00->rep_dim = this->rep_dim;
    local_28 = this_00;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this_00->path,&this->path);
    __position._M_current =
         (local_28->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_28->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_28->path,__position,
                 &local_2c);
    }
    else {
      *__position._M_current = local_2c;
      (local_28->path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar3 = (long)(this->children).
                  super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->children).
                  super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar4 = uVar3 >> 3;
    local_20 = (uVar3 & 0xfffffffffffffff8) << 0x1d | (ulong)local_2c;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int,unsigned_int>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->word2ind);
    __position_00._M_current =
         (this->children).super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->children).super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<dynet::Cluster*,std::allocator<dynet::Cluster*>>::
      _M_realloc_insert<dynet::Cluster*const&>
                ((vector<dynet::Cluster*,std::allocator<dynet::Cluster*>> *)this,__position_00,
                 &local_28);
    }
    else {
      *__position_00._M_current = local_28;
      pppCVar1 = &(this->children).
                  super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  else {
    uVar4 = (ulong)*(uint *)((long)&p_Var2[1]._M_nxt + 4);
  }
  return (this->children).super__Vector_base<dynet::Cluster_*,_std::allocator<dynet::Cluster_*>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar4 & 0xffffffff];
}

Assistant:

Cluster* Cluster::add_child(unsigned sym) {
  auto it = word2ind.find(sym);
  unsigned i;
  if (it == word2ind.end()) {
    Cluster* c = new Cluster();
    c->rep_dim = rep_dim;
    c->path = path;
    c->path.push_back(sym);
    i = children.size();
    word2ind.insert(make_pair(sym, i));
    children.push_back(c);
  }
  else {
    i = it->second;
  }
  return children[i];
}